

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall higan::Thread::Start(Thread *this)

{
  int iVar1;
  undefined8 uVar2;
  ThreadInternalAttr *this_00;
  Fmt local_658;
  Logger local_558;
  ThreadInternalAttr *local_340;
  ThreadInternalAttr *attr;
  Fmt local_328;
  Logger local_228;
  Thread *local_10;
  Thread *this_local;
  
  local_10 = this;
  if ((this->started & 1U) != 0) {
    Logger::Logger(&local_228,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/Thread.cpp"
                   ,0x40,"Start");
    uVar2 = std::__cxx11::string::c_str();
    Fmt::Fmt(&local_328,"thread: %s had started",uVar2);
    Logger::operator<<(&local_228,&local_328);
    Logger::~Logger(&local_228);
  }
  this->started = true;
  this_00 = (ThreadInternalAttr *)operator_new(0x40);
  ThreadInternalAttr::ThreadInternalAttr(this_00,&this->name_,&this->function_);
  local_340 = this_00;
  iVar1 = pthread_create(&this->thread_,(pthread_attr_t *)0x0,ThreadInternalFunction,this_00);
  if (iVar1 != 0) {
    Logger::Logger(&local_558,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/Thread.cpp"
                   ,0x49,"Start");
    uVar2 = std::__cxx11::string::c_str();
    Fmt::Fmt(&local_658,"thread: %s pthread_create error",uVar2);
    Logger::operator<<(&local_558,&local_658);
    Logger::~Logger(&local_558);
  }
  return;
}

Assistant:

void Thread::Start()
{
	if (started)
	{
		LOG_FATAL << higan::Fmt("thread: %s had started", name_.c_str());
	}

	started = true;

	ThreadInternalAttr *attr = new ThreadInternalAttr(name_, function_);

	if (pthread_create(&thread_, nullptr, ThreadInternalFunction, static_cast<void*>(attr)) != 0)
	{
		LOG_FATAL << higan::Fmt("thread: %s pthread_create error", name_.c_str());
	}

}